

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void kratos::MergeWireAssignmentsVisitor::extract_sliced_stmts
               (Generator *generator,
               set<std::shared_ptr<kratos::AssignStmt>,_std::less<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
               *sliced_stmts)

{
  StatementType SVar1;
  VarType VVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *this;
  element_type *peVar4;
  Var **ppVVar5;
  undefined1 local_48 [8];
  shared_ptr<kratos::AssignStmt> assign_stmt;
  shared_ptr<kratos::Stmt> stmt;
  uint64_t i;
  uint64_t stmt_count;
  set<std::shared_ptr<kratos::AssignStmt>,_std::less<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *sliced_stmts_local;
  Generator *generator_local;
  
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Generator::stmts_count(generator);
  for (stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi < p_Var3;
      stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi)->_vptr__Sp_counted_base + 1)) {
    Generator::get_stmt((Generator *)
                        &assign_stmt.
                         super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount,(uint32_t)generator);
    this = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )&assign_stmt.
                        super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    SVar1 = Stmt::type(this);
    if (SVar1 == Assign) {
      std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 &assign_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      Stmt::as<kratos::AssignStmt>((Stmt *)local_48);
      peVar4 = std::
               __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_48);
      ppVVar5 = AssignStmt::left(peVar4);
      VVar2 = Var::type(*ppVVar5);
      if (VVar2 == Slice) {
        peVar4 = std::
                 __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_48);
        ppVVar5 = AssignStmt::right(peVar4);
        VVar2 = Var::type(*ppVVar5);
        if (VVar2 == Slice) {
          std::
          set<std::shared_ptr<kratos::AssignStmt>,std::less<std::shared_ptr<kratos::AssignStmt>>,std::allocator<std::shared_ptr<kratos::AssignStmt>>>
          ::emplace<std::shared_ptr<kratos::AssignStmt>&>
                    ((set<std::shared_ptr<kratos::AssignStmt>,std::less<std::shared_ptr<kratos::AssignStmt>>,std::allocator<std::shared_ptr<kratos::AssignStmt>>>
                      *)sliced_stmts,(shared_ptr<kratos::AssignStmt> *)local_48);
        }
      }
      std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_48);
    }
    std::shared_ptr<kratos::Stmt>::~shared_ptr
              ((shared_ptr<kratos::Stmt> *)
               &assign_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return;
}

Assistant:

static void extract_sliced_stmts(Generator* generator,
                                     std::set<std::shared_ptr<AssignStmt>>& sliced_stmts) {
        uint64_t stmt_count = generator->stmts_count();
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto stmt = generator->get_stmt(i);
            if (stmt->type() == StatementType::Assign) {
                auto assign_stmt = stmt->as<AssignStmt>();
                if (assign_stmt->left()->type() == VarType::Slice &&
                    assign_stmt->right()->type() == VarType::Slice) {
                    sliced_stmts.emplace(assign_stmt);
                }
            }
        }
    }